

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_3_suite::test_ctor(void)

{
  undefined8 local_80;
  value_type local_78;
  undefined4 local_6c;
  size_type local_68;
  undefined1 local_5a;
  undefined1 local_59 [2];
  undefined1 local_57;
  undefined1 local_56 [2];
  undefined4 local_54;
  size_type local_50 [2];
  undefined1 local_40 [8];
  moment<double,_3> filter;
  
  trial::online::window::basic_moment<double,_3UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_3UL,_(trial::online::with)1> *)local_40);
  local_50[0] = trial::online::window::basic_moment<double,_3UL,_(trial::online::with)1>::capacity
                          ((basic_moment<double,_3UL,_(trial::online::with)1> *)local_40);
  local_54 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xac,"void mean_double_3_suite::test_ctor()",local_50,&local_54);
  local_56[0] = trial::online::window::basic_moment<double,_3UL,_(trial::online::with)1>::empty
                          ((basic_moment<double,_3UL,_(trial::online::with)1> *)local_40);
  local_57 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xad,"void mean_double_3_suite::test_ctor()",local_56,&local_57);
  local_59[0] = trial::online::window::basic_moment<double,_3UL,_(trial::online::with)1>::full
                          ((basic_moment<double,_3UL,_(trial::online::with)1> *)local_40);
  local_5a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xae,"void mean_double_3_suite::test_ctor()",local_59,&local_5a);
  local_68 = trial::online::window::basic_moment<double,_3UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_3UL,_(trial::online::with)1> *)local_40);
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xaf,"void mean_double_3_suite::test_ctor()",&local_68,&local_6c);
  local_78 = trial::online::window::basic_moment<double,_3UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_3UL,_(trial::online::with)1> *)local_40);
  local_80 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xb0,"void mean_double_3_suite::test_ctor()",&local_78,&local_80);
  return;
}

Assistant:

void test_ctor()
{
    window::moment<double, 3> filter;
    TRIAL_TEST_EQ(filter.capacity(), 3);
    TRIAL_TEST_EQ(filter.empty(), true);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 0);
    TRIAL_TEST_EQ(filter.mean(), 0.0);
}